

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscrete.cpp
# Opt level: O0

void __thiscall
JointPolicyDiscrete::SampleJointActionVector
          (JointPolicyDiscrete *this,Index i,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sampled_aIs)

{
  uint uVar1;
  int iVar2;
  Interface_ProblemToPolicyDiscrete *pIVar3;
  undefined4 extraout_var;
  uint in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivDomIndices_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indivDomIndices;
  JointPolicyDiscrete *in_stack_ffffffffffffffa8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd8;
  JointPolicyDiscrete *in_stack_ffffffffffffffe0;
  
  pIVar3 = GetInterfacePTPDiscrete(in_stack_ffffffffffffffa8);
  uVar1 = (*pIVar3->_vptr_Interface_ProblemToPolicyDiscrete[2])
                    (pIVar3,(ulong)*(uint *)(in_RDI + 0x18));
  if ((uVar1 & 1) == 0) {
    pIVar3 = GetInterfacePTPDiscrete(in_stack_ffffffffffffffa8);
    (*pIVar3->_vptr_Interface_ProblemToPolicyDiscrete[9])
              (local_38,pIVar3,(ulong)in_ESI,(ulong)*(uint *)(in_RDI + 0x18),in_R8,in_R9,local_38);
    SampleJointActionVector
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffc0);
  }
  else {
    pIVar3 = GetInterfacePTPDiscrete(in_stack_ffffffffffffffa8);
    iVar2 = (*pIVar3->_vptr_Interface_ProblemToPolicyDiscrete[10])
                      (pIVar3,(ulong)in_ESI,(ulong)*(uint *)(in_RDI + 0x18));
    SampleJointActionVector
              ((JointPolicyDiscrete *)CONCAT44(extraout_var,iVar2),in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void
JointPolicyDiscrete::SampleJointActionVector( Index i, 
       vector<Index>& sampled_aIs ) const
{

    if( GetInterfacePTPDiscrete()->AreCachedJointToIndivIndices(_m_indexDomCat) )
    {
        const vector<Index>& indivDomIndices = GetInterfacePTPDiscrete()->
            JointToIndividualPolicyDomainIndicesRef (i, _m_indexDomCat);
        return( SampleJointActionVector( indivDomIndices, sampled_aIs) );
    }
    else
    {
        vector<Index> indivDomIndices = GetInterfacePTPDiscrete()->    
            JointToIndividualPolicyDomainIndices(i, _m_indexDomCat);
        return( SampleJointActionVector( indivDomIndices, sampled_aIs) );
    }
            
}